

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5Dequote(char *z)

{
  int local_1c;
  int local_18;
  int iOut;
  int iIn;
  char q;
  char *z_local;
  
  local_18 = 1;
  local_1c = 0;
  iOut._3_1_ = *z;
  if (iOut._3_1_ == '[') {
    iOut._3_1_ = ']';
  }
  do {
    if (z[local_18] == '\0') {
LAB_001f222a:
      z[local_1c] = '\0';
      return local_18;
    }
    if (z[local_18] == iOut._3_1_) {
      if (z[local_18 + 1] != iOut._3_1_) {
        local_18 = local_18 + 1;
        goto LAB_001f222a;
      }
      z[local_1c] = iOut._3_1_;
      local_18 = local_18 + 2;
    }
    else {
      z[local_1c] = z[local_18];
      local_18 = local_18 + 1;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static int fts5Dequote(char *z){
  char q;
  int iIn = 1;
  int iOut = 0;
  q = z[0];

  /* Set stack variable q to the close-quote character */
  assert( q=='[' || q=='\'' || q=='"' || q=='`' );
  if( q=='[' ) q = ']';  

  while( ALWAYS(z[iIn]) ){
    if( z[iIn]==q ){
      if( z[iIn+1]!=q ){
        /* Character iIn was the close quote. */
        iIn++;
        break;
      }else{
        /* Character iIn and iIn+1 form an escaped quote character. Skip
        ** the input cursor past both and copy a single quote character 
        ** to the output buffer. */
        iIn += 2;
        z[iOut++] = q;
      }
    }else{
      z[iOut++] = z[iIn++];
    }
  }

  z[iOut] = '\0';
  return iIn;
}